

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iadst8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  undefined1 auVar9 [16];
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar18;
  int iVar19;
  undefined1 auVar17 [16];
  int iVar20;
  int iVar21;
  int iVar24;
  int iVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  int iVar27;
  int iVar30;
  int iVar31;
  __m128i offset;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar32;
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar36;
  uint uVar37;
  undefined1 auVar35 [16];
  uint uVar38;
  int iVar39;
  uint uVar40;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  undefined1 auVar41 [16];
  int iVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  int iVar49;
  uint uVar50;
  int iVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  undefined1 auVar51 [16];
  int iVar56;
  uint uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  int iVar67;
  int iVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  int iVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  undefined1 auVar66 [16];
  int iVar79;
  uint uVar80;
  int iVar84;
  uint uVar85;
  int iVar86;
  uint uVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar88;
  uint uVar89;
  int iVar90;
  int iVar92;
  int iVar93;
  undefined1 auVar91 [16];
  int iVar94;
  undefined1 local_48 [16];
  
  lVar3 = (long)bit * 0x100;
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x220);
  iVar4 = 1 << ((char)bit - 1U & 0x1f);
  local_48._4_4_ = -iVar8;
  iVar5 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar2 = 0x8000;
  if (0xf < iVar5) {
    iVar2 = 1 << ((char)iVar5 - 1U & 0x1f);
  }
  auVar33 = ZEXT416((uint)bit);
  iVar5 = -iVar2;
  iVar2 = iVar2 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x170);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x250);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1b0);
  auVar82._4_4_ = uVar1;
  auVar82._0_4_ = uVar1;
  auVar82._8_4_ = uVar1;
  auVar82._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x210);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1f0);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1d0);
  auVar83._4_4_ = uVar1;
  auVar83._0_4_ = uVar1;
  auVar83._8_4_ = uVar1;
  auVar83._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x230);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 400);
  auVar91._4_4_ = uVar1;
  auVar91._0_4_ = uVar1;
  auVar91._8_4_ = uVar1;
  auVar91._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1a0);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  local_48._0_4_ = local_48._4_4_;
  local_48._8_4_ = local_48._4_4_;
  local_48._12_4_ = local_48._4_4_;
  auVar9 = pmulld((undefined1  [16])in[7],auVar29);
  auVar22 = pmulld(auVar29,(undefined1  [16])*in);
  auVar81 = pmulld((undefined1  [16])*in,auVar65);
  auVar41 = pmulld((undefined1  [16])in[7],auVar65);
  auVar23 = pmulld((undefined1  [16])in[5],auVar82);
  auVar58 = pmulld(auVar82,(undefined1  [16])in[2]);
  auVar82 = pmulld((undefined1  [16])in[2],auVar64);
  auVar51 = pmulld((undefined1  [16])in[5],auVar64);
  auVar65 = pmulld((undefined1  [16])in[3],auVar59);
  auVar28 = pmulld(auVar59,(undefined1  [16])in[4]);
  auVar59 = pmulld((undefined1  [16])in[4],auVar83);
  auVar83 = pmulld((undefined1  [16])in[3],auVar83);
  auVar29 = pmulld((undefined1  [16])in[1],auVar48);
  auVar17 = pmulld(auVar48,(undefined1  [16])in[6]);
  auVar48 = pmulld((undefined1  [16])in[6],auVar91);
  auVar91 = pmulld((undefined1  [16])in[1],auVar91);
  iVar6 = auVar9._0_4_ + iVar4 + auVar81._0_4_ >> auVar33;
  iVar10 = auVar9._4_4_ + iVar4 + auVar81._4_4_ >> auVar33;
  iVar12 = auVar9._8_4_ + iVar4 + auVar81._8_4_ >> auVar33;
  iVar14 = auVar9._12_4_ + iVar4 + auVar81._12_4_ >> auVar33;
  iVar39 = (auVar41._0_4_ + iVar4) - auVar22._0_4_ >> auVar33;
  iVar42 = (auVar41._4_4_ + iVar4) - auVar22._4_4_ >> auVar33;
  iVar44 = (auVar41._8_4_ + iVar4) - auVar22._8_4_ >> auVar33;
  iVar46 = (auVar41._12_4_ + iVar4) - auVar22._12_4_ >> auVar33;
  iVar21 = auVar23._0_4_ + iVar4 + auVar82._0_4_ >> auVar33;
  iVar24 = auVar23._4_4_ + iVar4 + auVar82._4_4_ >> auVar33;
  iVar25 = auVar23._8_4_ + iVar4 + auVar82._8_4_ >> auVar33;
  iVar26 = auVar23._12_4_ + iVar4 + auVar82._12_4_ >> auVar33;
  iVar49 = (auVar51._0_4_ + iVar4) - auVar58._0_4_ >> auVar33;
  iVar52 = (auVar51._4_4_ + iVar4) - auVar58._4_4_ >> auVar33;
  iVar54 = (auVar51._8_4_ + iVar4) - auVar58._8_4_ >> auVar33;
  iVar56 = (auVar51._12_4_ + iVar4) - auVar58._12_4_ >> auVar33;
  iVar60 = auVar65._0_4_ + iVar4 + auVar59._0_4_ >> auVar33;
  iVar67 = auVar65._4_4_ + iVar4 + auVar59._4_4_ >> auVar33;
  iVar71 = auVar65._8_4_ + iVar4 + auVar59._8_4_ >> auVar33;
  iVar75 = auVar65._12_4_ + iVar4 + auVar59._12_4_ >> auVar33;
  iVar79 = (auVar83._0_4_ + iVar4) - auVar28._0_4_ >> auVar33;
  iVar84 = (auVar83._4_4_ + iVar4) - auVar28._4_4_ >> auVar33;
  iVar86 = (auVar83._8_4_ + iVar4) - auVar28._8_4_ >> auVar33;
  iVar88 = (auVar83._12_4_ + iVar4) - auVar28._12_4_ >> auVar33;
  iVar27 = auVar29._0_4_ + iVar4 + auVar48._0_4_ >> auVar33;
  iVar30 = auVar29._4_4_ + iVar4 + auVar48._4_4_ >> auVar33;
  iVar31 = auVar29._8_4_ + iVar4 + auVar48._8_4_ >> auVar33;
  iVar32 = auVar29._12_4_ + iVar4 + auVar48._12_4_ >> auVar33;
  iVar90 = (auVar91._0_4_ + iVar4) - auVar17._0_4_ >> auVar33;
  iVar92 = (auVar91._4_4_ + iVar4) - auVar17._4_4_ >> auVar33;
  iVar93 = (auVar91._8_4_ + iVar4) - auVar17._8_4_ >> auVar33;
  iVar94 = (auVar91._12_4_ + iVar4) - auVar17._12_4_ >> auVar33;
  iVar16 = iVar60 + iVar6;
  iVar18 = iVar67 + iVar10;
  iVar19 = iVar71 + iVar12;
  iVar20 = iVar75 + iVar14;
  iVar6 = iVar6 - iVar60;
  iVar10 = iVar10 - iVar67;
  iVar12 = iVar12 - iVar71;
  iVar14 = iVar14 - iVar75;
  uVar7 = (uint)(iVar6 < iVar5) * iVar5 | (uint)(iVar6 >= iVar5) * iVar6;
  uVar11 = (uint)(iVar10 < iVar5) * iVar5 | (uint)(iVar10 >= iVar5) * iVar10;
  uVar13 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar15 = (uint)(iVar14 < iVar5) * iVar5 | (uint)(iVar14 >= iVar5) * iVar14;
  auVar22._0_4_ = (uint)(iVar2 < (int)uVar7) * iVar2 | (iVar2 >= (int)uVar7) * uVar7;
  auVar22._4_4_ = (uint)(iVar2 < (int)uVar11) * iVar2 | (iVar2 >= (int)uVar11) * uVar11;
  auVar22._8_4_ = (uint)(iVar2 < (int)uVar13) * iVar2 | (iVar2 >= (int)uVar13) * uVar13;
  auVar22._12_4_ = (uint)(iVar2 < (int)uVar15) * iVar2 | (iVar2 >= (int)uVar15) * uVar15;
  iVar60 = iVar79 + iVar39;
  iVar67 = iVar84 + iVar42;
  iVar71 = iVar86 + iVar44;
  iVar75 = iVar88 + iVar46;
  iVar39 = iVar39 - iVar79;
  iVar42 = iVar42 - iVar84;
  iVar44 = iVar44 - iVar86;
  iVar46 = iVar46 - iVar88;
  uVar7 = (uint)(iVar39 < iVar5) * iVar5 | (uint)(iVar39 >= iVar5) * iVar39;
  uVar11 = (uint)(iVar42 < iVar5) * iVar5 | (uint)(iVar42 >= iVar5) * iVar42;
  uVar13 = (uint)(iVar44 < iVar5) * iVar5 | (uint)(iVar44 >= iVar5) * iVar44;
  uVar15 = (uint)(iVar46 < iVar5) * iVar5 | (uint)(iVar46 >= iVar5) * iVar46;
  auVar58._0_4_ = (uint)(iVar2 < (int)uVar7) * iVar2 | (iVar2 >= (int)uVar7) * uVar7;
  auVar58._4_4_ = (uint)(iVar2 < (int)uVar11) * iVar2 | (iVar2 >= (int)uVar11) * uVar11;
  auVar58._8_4_ = (uint)(iVar2 < (int)uVar13) * iVar2 | (iVar2 >= (int)uVar13) * uVar13;
  auVar58._12_4_ = (uint)(iVar2 < (int)uVar15) * iVar2 | (iVar2 >= (int)uVar15) * uVar15;
  iVar39 = iVar27 + iVar21;
  iVar42 = iVar30 + iVar24;
  iVar44 = iVar31 + iVar25;
  iVar46 = iVar32 + iVar26;
  iVar21 = iVar21 - iVar27;
  iVar24 = iVar24 - iVar30;
  iVar25 = iVar25 - iVar31;
  iVar26 = iVar26 - iVar32;
  uVar7 = (uint)(iVar21 < iVar5) * iVar5 | (uint)(iVar21 >= iVar5) * iVar21;
  uVar11 = (uint)(iVar24 < iVar5) * iVar5 | (uint)(iVar24 >= iVar5) * iVar24;
  uVar13 = (uint)(iVar25 < iVar5) * iVar5 | (uint)(iVar25 >= iVar5) * iVar25;
  uVar15 = (uint)(iVar26 < iVar5) * iVar5 | (uint)(iVar26 >= iVar5) * iVar26;
  auVar41._0_4_ = (uint)(iVar2 < (int)uVar7) * iVar2 | (iVar2 >= (int)uVar7) * uVar7;
  auVar41._4_4_ = (uint)(iVar2 < (int)uVar11) * iVar2 | (iVar2 >= (int)uVar11) * uVar11;
  auVar41._8_4_ = (uint)(iVar2 < (int)uVar13) * iVar2 | (iVar2 >= (int)uVar13) * uVar13;
  auVar41._12_4_ = (uint)(iVar2 < (int)uVar15) * iVar2 | (iVar2 >= (int)uVar15) * uVar15;
  iVar6 = iVar90 + iVar49;
  iVar10 = iVar92 + iVar52;
  iVar12 = iVar93 + iVar54;
  iVar14 = iVar94 + iVar56;
  iVar49 = iVar49 - iVar90;
  iVar52 = iVar52 - iVar92;
  iVar54 = iVar54 - iVar93;
  iVar56 = iVar56 - iVar94;
  uVar7 = (uint)(iVar49 < iVar5) * iVar5 | (uint)(iVar49 >= iVar5) * iVar49;
  uVar11 = (uint)(iVar52 < iVar5) * iVar5 | (uint)(iVar52 >= iVar5) * iVar52;
  uVar13 = (uint)(iVar54 < iVar5) * iVar5 | (uint)(iVar54 >= iVar5) * iVar54;
  uVar15 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  auVar81._0_4_ = (uint)(iVar2 < (int)uVar7) * iVar2 | (iVar2 >= (int)uVar7) * uVar7;
  auVar81._4_4_ = (uint)(iVar2 < (int)uVar11) * iVar2 | (iVar2 >= (int)uVar11) * uVar11;
  auVar81._8_4_ = (uint)(iVar2 < (int)uVar13) * iVar2 | (iVar2 >= (int)uVar13) * uVar13;
  auVar81._12_4_ = (uint)(iVar2 < (int)uVar15) * iVar2 | (iVar2 >= (int)uVar15) * uVar15;
  auVar48 = pmulld(auVar22,auVar35);
  auVar59 = pmulld(auVar41,local_48);
  auVar17 = pmulld(local_48,auVar81);
  auVar29 = pmulld(auVar81,auVar35);
  auVar23 = pmulld(auVar41,auVar35);
  auVar91 = pmulld(auVar35,auVar58);
  auVar9._4_4_ = iVar8;
  auVar9._0_4_ = iVar8;
  auVar9._8_4_ = iVar8;
  auVar9._12_4_ = iVar8;
  auVar28 = pmulld(auVar58,auVar9);
  auVar9 = pmulld(auVar22,auVar9);
  uVar7 = (uint)(iVar16 < iVar5) * iVar5 | (uint)(iVar16 >= iVar5) * iVar16;
  uVar11 = (uint)(iVar18 < iVar5) * iVar5 | (uint)(iVar18 >= iVar5) * iVar18;
  uVar13 = (uint)(iVar19 < iVar5) * iVar5 | (uint)(iVar19 >= iVar5) * iVar19;
  uVar15 = (uint)(iVar20 < iVar5) * iVar5 | (uint)(iVar20 >= iVar5) * iVar20;
  uVar7 = (uint)(iVar2 < (int)uVar7) * iVar2 | (iVar2 >= (int)uVar7) * uVar7;
  uVar11 = (uint)(iVar2 < (int)uVar11) * iVar2 | (iVar2 >= (int)uVar11) * uVar11;
  uVar13 = (uint)(iVar2 < (int)uVar13) * iVar2 | (iVar2 >= (int)uVar13) * uVar13;
  uVar15 = (uint)(iVar2 < (int)uVar15) * iVar2 | (iVar2 >= (int)uVar15) * uVar15;
  uVar61 = (uint)(iVar60 < iVar5) * iVar5 | (uint)(iVar60 >= iVar5) * iVar60;
  uVar68 = (uint)(iVar67 < iVar5) * iVar5 | (uint)(iVar67 >= iVar5) * iVar67;
  uVar72 = (uint)(iVar71 < iVar5) * iVar5 | (uint)(iVar71 >= iVar5) * iVar71;
  uVar76 = (uint)(iVar75 < iVar5) * iVar5 | (uint)(iVar75 >= iVar5) * iVar75;
  uVar62 = (uint)(iVar2 < (int)uVar61) * iVar2 | (iVar2 >= (int)uVar61) * uVar61;
  uVar69 = (uint)(iVar2 < (int)uVar68) * iVar2 | (iVar2 >= (int)uVar68) * uVar68;
  uVar73 = (uint)(iVar2 < (int)uVar72) * iVar2 | (iVar2 >= (int)uVar72) * uVar72;
  uVar77 = (uint)(iVar2 < (int)uVar76) * iVar2 | (iVar2 >= (int)uVar76) * uVar76;
  uVar61 = (uint)(iVar39 < iVar5) * iVar5 | (uint)(iVar39 >= iVar5) * iVar39;
  uVar68 = (uint)(iVar42 < iVar5) * iVar5 | (uint)(iVar42 >= iVar5) * iVar42;
  uVar72 = (uint)(iVar44 < iVar5) * iVar5 | (uint)(iVar44 >= iVar5) * iVar44;
  uVar76 = (uint)(iVar46 < iVar5) * iVar5 | (uint)(iVar46 >= iVar5) * iVar46;
  uVar80 = (uint)(iVar2 < (int)uVar61) * iVar2 | (iVar2 >= (int)uVar61) * uVar61;
  uVar85 = (uint)(iVar2 < (int)uVar68) * iVar2 | (iVar2 >= (int)uVar68) * uVar68;
  uVar87 = (uint)(iVar2 < (int)uVar72) * iVar2 | (iVar2 >= (int)uVar72) * uVar72;
  uVar89 = (uint)(iVar2 < (int)uVar76) * iVar2 | (iVar2 >= (int)uVar76) * uVar76;
  uVar61 = (uint)(iVar6 < iVar5) * iVar5 | (uint)(iVar6 >= iVar5) * iVar6;
  uVar68 = (uint)(iVar10 < iVar5) * iVar5 | (uint)(iVar10 >= iVar5) * iVar10;
  uVar72 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar76 = (uint)(iVar14 < iVar5) * iVar5 | (uint)(iVar14 >= iVar5) * iVar14;
  uVar61 = (uint)(iVar2 < (int)uVar61) * iVar2 | (iVar2 >= (int)uVar61) * uVar61;
  uVar68 = (uint)(iVar2 < (int)uVar68) * iVar2 | (iVar2 >= (int)uVar68) * uVar68;
  uVar72 = (uint)(iVar2 < (int)uVar72) * iVar2 | (iVar2 >= (int)uVar72) * uVar72;
  uVar76 = (uint)(iVar2 < (int)uVar76) * iVar2 | (iVar2 >= (int)uVar76) * uVar76;
  iVar20 = auVar48._0_4_ + iVar4 + auVar28._0_4_ >> auVar33;
  iVar21 = auVar48._4_4_ + iVar4 + auVar28._4_4_ >> auVar33;
  iVar24 = auVar48._8_4_ + iVar4 + auVar28._8_4_ >> auVar33;
  iVar25 = auVar48._12_4_ + iVar4 + auVar28._12_4_ >> auVar33;
  iVar8 = (auVar9._0_4_ + iVar4) - auVar91._0_4_ >> auVar33;
  iVar6 = (auVar9._4_4_ + iVar4) - auVar91._4_4_ >> auVar33;
  iVar10 = (auVar9._8_4_ + iVar4) - auVar91._8_4_ >> auVar33;
  iVar12 = (auVar9._12_4_ + iVar4) - auVar91._12_4_ >> auVar33;
  iVar32 = auVar59._0_4_ + iVar4 + auVar29._0_4_ >> auVar33;
  iVar39 = auVar59._4_4_ + iVar4 + auVar29._4_4_ >> auVar33;
  iVar42 = auVar59._8_4_ + iVar4 + auVar29._8_4_ >> auVar33;
  iVar44 = auVar59._12_4_ + iVar4 + auVar29._12_4_ >> auVar33;
  local_48._0_4_ = auVar17._0_4_;
  local_48._4_4_ = auVar17._4_4_;
  local_48._8_4_ = auVar17._8_4_;
  local_48._12_4_ = auVar17._12_4_;
  iVar26 = (auVar23._0_4_ + iVar4) - local_48._0_4_ >> auVar33;
  iVar27 = (auVar23._4_4_ + iVar4) - local_48._4_4_ >> auVar33;
  iVar30 = (auVar23._8_4_ + iVar4) - local_48._8_4_ >> auVar33;
  iVar31 = (auVar23._12_4_ + iVar4) - local_48._12_4_ >> auVar33;
  iVar46 = uVar80 + uVar7;
  iVar49 = uVar85 + uVar11;
  iVar52 = uVar87 + uVar13;
  iVar54 = uVar89 + uVar15;
  iVar14 = uVar7 - uVar80;
  iVar16 = uVar11 - uVar85;
  iVar18 = uVar13 - uVar87;
  iVar19 = uVar15 - uVar89;
  iVar75 = uVar61 + uVar62;
  iVar79 = uVar68 + uVar69;
  iVar84 = uVar72 + uVar73;
  iVar86 = uVar76 + uVar77;
  iVar88 = uVar62 - uVar61;
  iVar90 = uVar69 - uVar68;
  iVar92 = uVar73 - uVar72;
  iVar93 = uVar77 - uVar76;
  iVar56 = iVar32 + iVar20;
  iVar60 = iVar39 + iVar21;
  iVar67 = iVar42 + iVar24;
  iVar71 = iVar44 + iVar25;
  iVar20 = iVar20 - iVar32;
  iVar21 = iVar21 - iVar39;
  iVar24 = iVar24 - iVar42;
  iVar25 = iVar25 - iVar44;
  iVar32 = iVar26 + iVar8;
  iVar39 = iVar27 + iVar6;
  iVar42 = iVar30 + iVar10;
  iVar44 = iVar31 + iVar12;
  iVar8 = iVar8 - iVar26;
  iVar6 = iVar6 - iVar27;
  iVar10 = iVar10 - iVar30;
  iVar12 = iVar12 - iVar31;
  uVar34 = (uint)(iVar46 < iVar5) * iVar5 | (uint)(iVar46 >= iVar5) * iVar46;
  uVar36 = (uint)(iVar49 < iVar5) * iVar5 | (uint)(iVar49 >= iVar5) * iVar49;
  uVar37 = (uint)(iVar52 < iVar5) * iVar5 | (uint)(iVar52 >= iVar5) * iVar52;
  uVar38 = (uint)(iVar54 < iVar5) * iVar5 | (uint)(iVar54 >= iVar5) * iVar54;
  uVar61 = (uint)(iVar14 < iVar5) * iVar5 | (uint)(iVar14 >= iVar5) * iVar14;
  uVar68 = (uint)(iVar16 < iVar5) * iVar5 | (uint)(iVar16 >= iVar5) * iVar16;
  uVar72 = (uint)(iVar18 < iVar5) * iVar5 | (uint)(iVar18 >= iVar5) * iVar18;
  uVar76 = (uint)(iVar19 < iVar5) * iVar5 | (uint)(iVar19 >= iVar5) * iVar19;
  uVar50 = (uint)(iVar75 < iVar5) * iVar5 | (uint)(iVar75 >= iVar5) * iVar75;
  uVar53 = (uint)(iVar79 < iVar5) * iVar5 | (uint)(iVar79 >= iVar5) * iVar79;
  uVar55 = (uint)(iVar84 < iVar5) * iVar5 | (uint)(iVar84 >= iVar5) * iVar84;
  uVar57 = (uint)(iVar86 < iVar5) * iVar5 | (uint)(iVar86 >= iVar5) * iVar86;
  uVar63 = (uint)(iVar88 < iVar5) * iVar5 | (uint)(iVar88 >= iVar5) * iVar88;
  uVar70 = (uint)(iVar90 < iVar5) * iVar5 | (uint)(iVar90 >= iVar5) * iVar90;
  uVar74 = (uint)(iVar92 < iVar5) * iVar5 | (uint)(iVar92 >= iVar5) * iVar92;
  uVar78 = (uint)(iVar93 < iVar5) * iVar5 | (uint)(iVar93 >= iVar5) * iVar93;
  uVar40 = (uint)(iVar56 < iVar5) * iVar5 | (uint)(iVar56 >= iVar5) * iVar56;
  uVar43 = (uint)(iVar60 < iVar5) * iVar5 | (uint)(iVar60 >= iVar5) * iVar60;
  uVar45 = (uint)(iVar67 < iVar5) * iVar5 | (uint)(iVar67 >= iVar5) * iVar67;
  uVar47 = (uint)(iVar71 < iVar5) * iVar5 | (uint)(iVar71 >= iVar5) * iVar71;
  uVar62 = (uint)(iVar20 < iVar5) * iVar5 | (uint)(iVar20 >= iVar5) * iVar20;
  uVar69 = (uint)(iVar21 < iVar5) * iVar5 | (uint)(iVar21 >= iVar5) * iVar21;
  uVar73 = (uint)(iVar24 < iVar5) * iVar5 | (uint)(iVar24 >= iVar5) * iVar24;
  uVar77 = (uint)(iVar25 < iVar5) * iVar5 | (uint)(iVar25 >= iVar5) * iVar25;
  uVar80 = (uint)(iVar32 < iVar5) * iVar5 | (uint)(iVar32 >= iVar5) * iVar32;
  uVar85 = (uint)(iVar39 < iVar5) * iVar5 | (uint)(iVar39 >= iVar5) * iVar39;
  uVar87 = (uint)(iVar42 < iVar5) * iVar5 | (uint)(iVar42 >= iVar5) * iVar42;
  uVar89 = (uint)(iVar44 < iVar5) * iVar5 | (uint)(iVar44 >= iVar5) * iVar44;
  uVar7 = (uint)(iVar8 < iVar5) * iVar5 | (uint)(iVar8 >= iVar5) * iVar8;
  uVar11 = (uint)(iVar6 < iVar5) * iVar5 | (uint)(iVar6 >= iVar5) * iVar6;
  uVar13 = (uint)(iVar10 < iVar5) * iVar5 | (uint)(iVar10 >= iVar5) * iVar10;
  uVar15 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1e0);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  uVar34 = (uint)(iVar2 < (int)uVar34) * iVar2 | (iVar2 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(iVar2 < (int)uVar36) * iVar2 | (iVar2 >= (int)uVar36) * uVar36;
  uVar37 = (uint)(iVar2 < (int)uVar37) * iVar2 | (iVar2 >= (int)uVar37) * uVar37;
  uVar38 = (uint)(iVar2 < (int)uVar38) * iVar2 | (iVar2 >= (int)uVar38) * uVar38;
  auVar23._0_4_ = (uint)(iVar2 < (int)uVar61) * iVar2 | (iVar2 >= (int)uVar61) * uVar61;
  auVar23._4_4_ = (uint)(iVar2 < (int)uVar68) * iVar2 | (iVar2 >= (int)uVar68) * uVar68;
  auVar23._8_4_ = (uint)(iVar2 < (int)uVar72) * iVar2 | (iVar2 >= (int)uVar72) * uVar72;
  auVar23._12_4_ = (uint)(iVar2 < (int)uVar76) * iVar2 | (iVar2 >= (int)uVar76) * uVar76;
  uVar50 = (uint)(iVar2 < (int)uVar50) * iVar2 | (iVar2 >= (int)uVar50) * uVar50;
  uVar53 = (uint)(iVar2 < (int)uVar53) * iVar2 | (iVar2 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar2 < (int)uVar55) * iVar2 | (iVar2 >= (int)uVar55) * uVar55;
  uVar57 = (uint)(iVar2 < (int)uVar57) * iVar2 | (iVar2 >= (int)uVar57) * uVar57;
  auVar66._0_4_ = (uint)(iVar2 < (int)uVar63) * iVar2 | (iVar2 >= (int)uVar63) * uVar63;
  auVar66._4_4_ = (uint)(iVar2 < (int)uVar70) * iVar2 | (iVar2 >= (int)uVar70) * uVar70;
  auVar66._8_4_ = (uint)(iVar2 < (int)uVar74) * iVar2 | (iVar2 >= (int)uVar74) * uVar74;
  auVar66._12_4_ = (uint)(iVar2 < (int)uVar78) * iVar2 | (iVar2 >= (int)uVar78) * uVar78;
  uVar40 = (uint)(iVar2 < (int)uVar40) * iVar2 | (iVar2 >= (int)uVar40) * uVar40;
  uVar43 = (uint)(iVar2 < (int)uVar43) * iVar2 | (iVar2 >= (int)uVar43) * uVar43;
  uVar45 = (uint)(iVar2 < (int)uVar45) * iVar2 | (iVar2 >= (int)uVar45) * uVar45;
  uVar47 = (uint)(iVar2 < (int)uVar47) * iVar2 | (iVar2 >= (int)uVar47) * uVar47;
  auVar28._0_4_ = (uint)(iVar2 < (int)uVar62) * iVar2 | (iVar2 >= (int)uVar62) * uVar62;
  auVar28._4_4_ = (uint)(iVar2 < (int)uVar69) * iVar2 | (iVar2 >= (int)uVar69) * uVar69;
  auVar28._8_4_ = (uint)(iVar2 < (int)uVar73) * iVar2 | (iVar2 >= (int)uVar73) * uVar73;
  auVar28._12_4_ = (uint)(iVar2 < (int)uVar77) * iVar2 | (iVar2 >= (int)uVar77) * uVar77;
  uVar61 = (uint)(iVar2 < (int)uVar80) * iVar2 | (iVar2 >= (int)uVar80) * uVar80;
  uVar68 = (uint)(iVar2 < (int)uVar85) * iVar2 | (iVar2 >= (int)uVar85) * uVar85;
  uVar72 = (uint)(iVar2 < (int)uVar87) * iVar2 | (iVar2 >= (int)uVar87) * uVar87;
  uVar76 = (uint)(iVar2 < (int)uVar89) * iVar2 | (iVar2 >= (int)uVar89) * uVar89;
  auVar17._0_4_ = (uint)(iVar2 < (int)uVar7) * iVar2 | (iVar2 >= (int)uVar7) * uVar7;
  auVar17._4_4_ = (uint)(iVar2 < (int)uVar11) * iVar2 | (iVar2 >= (int)uVar11) * uVar11;
  auVar17._8_4_ = (uint)(iVar2 < (int)uVar13) * iVar2 | (iVar2 >= (int)uVar13) * uVar13;
  auVar17._12_4_ = (uint)(iVar2 < (int)uVar15) * iVar2 | (iVar2 >= (int)uVar15) * uVar15;
  auVar9 = pmulld(auVar23,auVar51);
  auVar48 = pmulld(auVar66,auVar51);
  iVar8 = auVar9._0_4_ + iVar4;
  iVar2 = auVar9._4_4_ + iVar4;
  iVar5 = auVar9._8_4_ + iVar4;
  iVar6 = auVar9._12_4_ + iVar4;
  auVar22 = pmulld(auVar28,auVar51);
  auVar9 = pmulld(auVar17,auVar51);
  iVar18 = auVar22._0_4_ + iVar4;
  iVar19 = auVar22._4_4_ + iVar4;
  iVar20 = auVar22._8_4_ + iVar4;
  iVar4 = auVar22._12_4_ + iVar4;
  iVar21 = iVar8 + auVar48._0_4_ >> auVar33;
  iVar24 = iVar2 + auVar48._4_4_ >> auVar33;
  iVar25 = iVar5 + auVar48._8_4_ >> auVar33;
  iVar26 = iVar6 + auVar48._12_4_ >> auVar33;
  iVar8 = iVar8 - auVar48._0_4_ >> auVar33;
  iVar2 = iVar2 - auVar48._4_4_ >> auVar33;
  iVar5 = iVar5 - auVar48._8_4_ >> auVar33;
  iVar6 = iVar6 - auVar48._12_4_ >> auVar33;
  iVar10 = iVar18 + auVar9._0_4_ >> auVar33;
  iVar12 = iVar19 + auVar9._4_4_ >> auVar33;
  iVar14 = iVar20 + auVar9._8_4_ >> auVar33;
  iVar16 = iVar4 + auVar9._12_4_ >> auVar33;
  iVar18 = iVar18 - auVar9._0_4_ >> auVar33;
  iVar19 = iVar19 - auVar9._4_4_ >> auVar33;
  iVar20 = iVar20 - auVar9._8_4_ >> auVar33;
  iVar4 = iVar4 - auVar9._12_4_ >> auVar33;
  if (do_cols == 0) {
    iVar27 = 10;
    if (10 < bd) {
      iVar27 = bd;
    }
    iVar27 = 0x20 << ((byte)iVar27 & 0x1f);
    iVar30 = -iVar27;
    iVar27 = iVar27 + -1;
    iVar31 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar9 = ZEXT416((uint)out_shift);
    iVar32 = (int)(uVar34 + iVar31) >> auVar9;
    iVar39 = (int)(uVar36 + iVar31) >> auVar9;
    iVar42 = (int)(uVar37 + iVar31) >> auVar9;
    iVar44 = (int)(uVar38 + iVar31) >> auVar9;
    iVar46 = (int)(iVar31 - uVar40) >> auVar9;
    iVar49 = (int)(iVar31 - uVar43) >> auVar9;
    iVar52 = (int)(iVar31 - uVar45) >> auVar9;
    iVar54 = (int)(iVar31 - uVar47) >> auVar9;
    uVar7 = (uint)(iVar32 < iVar30) * iVar30 | (uint)(iVar32 >= iVar30) * iVar32;
    uVar11 = (uint)(iVar39 < iVar30) * iVar30 | (uint)(iVar39 >= iVar30) * iVar39;
    uVar13 = (uint)(iVar42 < iVar30) * iVar30 | (uint)(iVar42 >= iVar30) * iVar42;
    uVar15 = (uint)(iVar44 < iVar30) * iVar30 | (uint)(iVar44 >= iVar30) * iVar44;
    uVar62 = (uint)(iVar46 < iVar30) * iVar30 | (uint)(iVar46 >= iVar30) * iVar46;
    uVar69 = (uint)(iVar49 < iVar30) * iVar30 | (uint)(iVar49 >= iVar30) * iVar49;
    uVar73 = (uint)(iVar52 < iVar30) * iVar30 | (uint)(iVar52 >= iVar30) * iVar52;
    uVar77 = (uint)(iVar54 < iVar30) * iVar30 | (uint)(iVar54 >= iVar30) * iVar54;
    *(uint *)*out = (uint)(iVar27 < (int)uVar7) * iVar27 | (iVar27 >= (int)uVar7) * uVar7;
    *(uint *)((long)*out + 4) =
         (uint)(iVar27 < (int)uVar11) * iVar27 | (iVar27 >= (int)uVar11) * uVar11;
    *(uint *)(*out + 1) = (uint)(iVar27 < (int)uVar13) * iVar27 | (iVar27 >= (int)uVar13) * uVar13;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar27 < (int)uVar15) * iVar27 | (iVar27 >= (int)uVar15) * uVar15;
    iVar10 = iVar10 + iVar31 >> auVar9;
    iVar12 = iVar12 + iVar31 >> auVar9;
    iVar14 = iVar14 + iVar31 >> auVar9;
    iVar16 = iVar16 + iVar31 >> auVar9;
    iVar21 = iVar31 - iVar21 >> auVar9;
    iVar24 = iVar31 - iVar24 >> auVar9;
    iVar25 = iVar31 - iVar25 >> auVar9;
    iVar26 = iVar31 - iVar26 >> auVar9;
    *(uint *)out[1] = (uint)(iVar27 < (int)uVar62) * iVar27 | (iVar27 >= (int)uVar62) * uVar62;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar27 < (int)uVar69) * iVar27 | (iVar27 >= (int)uVar69) * uVar69;
    *(uint *)(out[1] + 1) = (uint)(iVar27 < (int)uVar73) * iVar27 | (iVar27 >= (int)uVar73) * uVar73
    ;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar27 < (int)uVar77) * iVar27 | (iVar27 >= (int)uVar77) * uVar77;
    uVar7 = (uint)(iVar10 < iVar30) * iVar30 | (uint)(iVar10 >= iVar30) * iVar10;
    uVar11 = (uint)(iVar12 < iVar30) * iVar30 | (uint)(iVar12 >= iVar30) * iVar12;
    uVar13 = (uint)(iVar14 < iVar30) * iVar30 | (uint)(iVar14 >= iVar30) * iVar14;
    uVar15 = (uint)(iVar16 < iVar30) * iVar30 | (uint)(iVar16 >= iVar30) * iVar16;
    uVar62 = (uint)(iVar21 < iVar30) * iVar30 | (uint)(iVar21 >= iVar30) * iVar21;
    uVar69 = (uint)(iVar24 < iVar30) * iVar30 | (uint)(iVar24 >= iVar30) * iVar24;
    uVar73 = (uint)(iVar25 < iVar30) * iVar30 | (uint)(iVar25 >= iVar30) * iVar25;
    uVar77 = (uint)(iVar26 < iVar30) * iVar30 | (uint)(iVar26 >= iVar30) * iVar26;
    *(uint *)out[2] = (uint)(iVar27 < (int)uVar7) * iVar27 | (iVar27 >= (int)uVar7) * uVar7;
    *(uint *)((long)out[2] + 4) =
         (uint)(iVar27 < (int)uVar11) * iVar27 | (iVar27 >= (int)uVar11) * uVar11;
    *(uint *)(out[2] + 1) = (uint)(iVar27 < (int)uVar13) * iVar27 | (iVar27 >= (int)uVar13) * uVar13
    ;
    *(uint *)((long)out[2] + 0xc) =
         (uint)(iVar27 < (int)uVar15) * iVar27 | (iVar27 >= (int)uVar15) * uVar15;
    *(uint *)out[3] = (uint)(iVar27 < (int)uVar62) * iVar27 | (iVar27 >= (int)uVar62) * uVar62;
    *(uint *)((long)out[3] + 4) =
         (uint)(iVar27 < (int)uVar69) * iVar27 | (iVar27 >= (int)uVar69) * uVar69;
    *(uint *)(out[3] + 1) = (uint)(iVar27 < (int)uVar73) * iVar27 | (iVar27 >= (int)uVar73) * uVar73
    ;
    *(uint *)((long)out[3] + 0xc) =
         (uint)(iVar27 < (int)uVar77) * iVar27 | (iVar27 >= (int)uVar77) * uVar77;
    iVar8 = iVar8 + iVar31 >> auVar9;
    iVar2 = iVar2 + iVar31 >> auVar9;
    iVar5 = iVar5 + iVar31 >> auVar9;
    iVar6 = iVar6 + iVar31 >> auVar9;
    iVar10 = iVar31 - iVar18 >> auVar9;
    iVar12 = iVar31 - iVar19 >> auVar9;
    iVar14 = iVar31 - iVar20 >> auVar9;
    iVar4 = iVar31 - iVar4 >> auVar9;
    uVar7 = (uint)(iVar8 < iVar30) * iVar30 | (uint)(iVar8 >= iVar30) * iVar8;
    uVar11 = (uint)(iVar2 < iVar30) * iVar30 | (uint)(iVar2 >= iVar30) * iVar2;
    uVar13 = (uint)(iVar5 < iVar30) * iVar30 | (uint)(iVar5 >= iVar30) * iVar5;
    uVar15 = (uint)(iVar6 < iVar30) * iVar30 | (uint)(iVar6 >= iVar30) * iVar6;
    uVar62 = (uint)(iVar10 < iVar30) * iVar30 | (uint)(iVar10 >= iVar30) * iVar10;
    uVar69 = (uint)(iVar12 < iVar30) * iVar30 | (uint)(iVar12 >= iVar30) * iVar12;
    uVar73 = (uint)(iVar14 < iVar30) * iVar30 | (uint)(iVar14 >= iVar30) * iVar14;
    uVar77 = (uint)(iVar4 < iVar30) * iVar30 | (uint)(iVar4 >= iVar30) * iVar4;
    *(uint *)out[4] = (uint)(iVar27 < (int)uVar7) * iVar27 | (iVar27 >= (int)uVar7) * uVar7;
    *(uint *)((long)out[4] + 4) =
         (uint)(iVar27 < (int)uVar11) * iVar27 | (iVar27 >= (int)uVar11) * uVar11;
    *(uint *)(out[4] + 1) = (uint)(iVar27 < (int)uVar13) * iVar27 | (iVar27 >= (int)uVar13) * uVar13
    ;
    *(uint *)((long)out[4] + 0xc) =
         (uint)(iVar27 < (int)uVar15) * iVar27 | (iVar27 >= (int)uVar15) * uVar15;
    *(uint *)out[5] = (uint)(iVar27 < (int)uVar62) * iVar27 | (iVar27 >= (int)uVar62) * uVar62;
    *(uint *)((long)out[5] + 4) =
         (uint)(iVar27 < (int)uVar69) * iVar27 | (iVar27 >= (int)uVar69) * uVar69;
    *(uint *)(out[5] + 1) = (uint)(iVar27 < (int)uVar73) * iVar27 | (iVar27 >= (int)uVar73) * uVar73
    ;
    *(uint *)((long)out[5] + 0xc) =
         (uint)(iVar27 < (int)uVar77) * iVar27 | (iVar27 >= (int)uVar77) * uVar77;
    iVar6 = (int)(uVar61 + iVar31) >> auVar9;
    iVar10 = (int)(uVar68 + iVar31) >> auVar9;
    iVar12 = (int)(uVar72 + iVar31) >> auVar9;
    iVar14 = (int)(uVar76 + iVar31) >> auVar9;
    iVar8 = (int)(iVar31 - uVar50) >> auVar9;
    iVar2 = (int)(iVar31 - uVar53) >> auVar9;
    iVar4 = (int)(iVar31 - uVar55) >> auVar9;
    iVar5 = (int)(iVar31 - uVar57) >> auVar9;
    uVar61 = (uint)(iVar6 < iVar30) * iVar30 | (uint)(iVar6 >= iVar30) * iVar6;
    uVar68 = (uint)(iVar10 < iVar30) * iVar30 | (uint)(iVar10 >= iVar30) * iVar10;
    uVar72 = (uint)(iVar12 < iVar30) * iVar30 | (uint)(iVar12 >= iVar30) * iVar12;
    uVar76 = (uint)(iVar14 < iVar30) * iVar30 | (uint)(iVar14 >= iVar30) * iVar14;
    uVar7 = (uint)(iVar8 < iVar30) * iVar30 | (uint)(iVar8 >= iVar30) * iVar8;
    uVar11 = (uint)(iVar2 < iVar30) * iVar30 | (uint)(iVar2 >= iVar30) * iVar2;
    uVar13 = (uint)(iVar4 < iVar30) * iVar30 | (uint)(iVar4 >= iVar30) * iVar4;
    uVar15 = (uint)(iVar5 < iVar30) * iVar30 | (uint)(iVar5 >= iVar30) * iVar5;
    *(uint *)out[6] = (uint)(iVar27 < (int)uVar61) * iVar27 | (iVar27 >= (int)uVar61) * uVar61;
    *(uint *)((long)out[6] + 4) =
         (uint)(iVar27 < (int)uVar68) * iVar27 | (iVar27 >= (int)uVar68) * uVar68;
    *(uint *)(out[6] + 1) = (uint)(iVar27 < (int)uVar72) * iVar27 | (iVar27 >= (int)uVar72) * uVar72
    ;
    *(uint *)((long)out[6] + 0xc) =
         (uint)(iVar27 < (int)uVar76) * iVar27 | (iVar27 >= (int)uVar76) * uVar76;
    *(uint *)out[7] = (uint)(iVar27 < (int)uVar7) * iVar27 | (iVar27 >= (int)uVar7) * uVar7;
    *(uint *)((long)out[7] + 4) =
         (uint)(iVar27 < (int)uVar11) * iVar27 | (iVar27 >= (int)uVar11) * uVar11;
    *(uint *)(out[7] + 1) = (uint)(iVar27 < (int)uVar13) * iVar27 | (iVar27 >= (int)uVar13) * uVar13
    ;
    *(uint *)((long)out[7] + 0xc) =
         (uint)(iVar27 < (int)uVar15) * iVar27 | (iVar27 >= (int)uVar15) * uVar15;
  }
  else {
    *(uint *)*out = uVar34;
    *(uint *)((long)*out + 4) = uVar36;
    *(uint *)(*out + 1) = uVar37;
    *(uint *)((long)*out + 0xc) = uVar38;
    *(uint *)out[1] = -uVar40;
    *(uint *)((long)out[1] + 4) = -uVar43;
    *(uint *)(out[1] + 1) = -uVar45;
    *(uint *)((long)out[1] + 0xc) = -uVar47;
    *(int *)out[2] = iVar10;
    *(int *)((long)out[2] + 4) = iVar12;
    *(int *)(out[2] + 1) = iVar14;
    *(int *)((long)out[2] + 0xc) = iVar16;
    *(int *)out[3] = -iVar21;
    *(int *)((long)out[3] + 4) = -iVar24;
    *(int *)(out[3] + 1) = -iVar25;
    *(int *)((long)out[3] + 0xc) = -iVar26;
    *(int *)out[4] = iVar8;
    *(int *)((long)out[4] + 4) = iVar2;
    *(int *)(out[4] + 1) = iVar5;
    *(int *)((long)out[4] + 0xc) = iVar6;
    *(int *)out[5] = -iVar18;
    *(int *)((long)out[5] + 4) = -iVar19;
    *(int *)(out[5] + 1) = -iVar20;
    *(int *)((long)out[5] + 0xc) = -iVar4;
    *(uint *)out[6] = uVar61;
    *(uint *)((long)out[6] + 4) = uVar68;
    *(uint *)(out[6] + 1) = uVar72;
    *(uint *)((long)out[6] + 0xc) = uVar76;
    *(uint *)out[7] = -uVar50;
    *(uint *)((long)out[7] + 4) = -uVar53;
    *(uint *)(out[7] + 1) = -uVar55;
    *(uint *)((long)out[7] + 0xc) = -uVar57;
  }
  return;
}

Assistant:

static void iadst8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                                int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm_mullo_epi32(in[7], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[7], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[5], cospi20);
  x = _mm_mullo_epi32(in[2], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[5], cospi44);
  x = _mm_mullo_epi32(in[2], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[3], cospi36);
  x = _mm_mullo_epi32(in[4], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[3], cospi28);
  x = _mm_mullo_epi32(in[4], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[1], cospi52);
  x = _mm_mullo_epi32(in[6], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[1], cospi12);
  x = _mm_mullo_epi32(in[6], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}